

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O2

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[3]);
  dVar3 = sin(*j);
  dVar4 = sin(j[3]);
  dVar5 = sin(j[4]);
  dVar6 = sin(j[1]);
  dVar7 = sin(j[2]);
  dVar8 = cos(j[1]);
  dVar9 = cos(j[2]);
  dVar10 = cos(j[4]);
  dVar11 = sin(j[5]);
  dVar12 = cos(j[5]);
  dVar29 = dVar6 * dVar7;
  dVar17 = dVar8 * dVar9;
  dVar9 = dVar6 * dVar9;
  dVar39 = dVar1 * dVar17 - dVar1 * dVar29;
  dVar18 = dVar1 * dVar29 - dVar1 * dVar17;
  dVar13 = dVar3 * dVar17 - dVar3 * dVar29;
  dVar33 = dVar3 * dVar29 - dVar3 * dVar17;
  dVar7 = dVar7 * dVar8;
  dVar14 = dVar7 + dVar9;
  dVar21 = dVar1 * dVar14;
  dVar27 = -dVar3 * dVar4 - dVar2 * dVar21;
  dVar15 = dVar4 * dVar21 - dVar3 * dVar2;
  dVar24 = dVar3 * dVar14;
  dVar22 = dVar1 * dVar4 - dVar2 * dVar24;
  dVar20 = dVar1 * dVar2 + dVar4 * dVar24;
  dVar25 = dVar5 * 3.9999999968e-05;
  dVar34 = dVar10 * 3.9999999968e-05;
  dVar30 = (dVar29 - dVar17) * dVar2;
  dVar35 = dVar5 * 0.9999999992;
  dVar23 = dVar10 * 0.9999999992;
  dVar19 = dVar23 * dVar30 + dVar35 * dVar14 + (dVar25 * dVar30 - dVar34 * dVar14);
  dVar16 = dVar23 * dVar27 + dVar25 * dVar27 + dVar35 * dVar18 + dVar34 * dVar39;
  dVar37 = dVar23 * dVar22 + dVar25 * dVar22 + dVar35 * dVar33 + dVar34 * dVar13;
  dVar31 = -dVar11;
  *eerot = dVar16 * dVar12 + dVar15 * dVar11;
  eerot[1] = dVar16 * dVar31 + dVar15 * dVar12;
  eerot[2] = dVar23 * dVar39 + ((dVar35 * dVar27 - dVar27 * dVar34) - dVar25 * dVar18);
  dVar15 = dVar5 * 0.134999999784;
  dVar16 = dVar1 * 0.175;
  dVar36 = dVar10 * -5.39999999136e-06;
  dVar32 = dVar10 * 0.134999999784;
  dVar26 = dVar1 * 2.159999996544e-10;
  dVar28 = dVar5 * -5.39999999136e-06;
  dVar38 = dVar1 * 5.39999999136e-06;
  *eetrans = (dVar38 * dVar29 - dVar17 * dVar38) * dVar5 +
             dVar18 * dVar28 +
             (dVar3 * dVar4 * -5.39999999136e-06 - dVar21 * dVar2 * 5.39999999136e-06) * dVar10 +
             (dVar26 * dVar17 - dVar29 * dVar26) * dVar10 +
             dVar1 * 1.271 * dVar17 +
             (dVar3 * dVar4 * -2.159999996544e-10 - dVar2 * 2.159999996544e-10 * dVar21) * dVar5 +
             dVar39 * dVar32 +
             dVar27 * dVar36 +
             dVar16 * dVar9 +
             dVar16 * dVar7 + ((dVar15 * dVar27 + dVar1 * dVar6 * 1.095) - dVar1 * 1.271 * dVar29) +
             dVar16;
  eerot[3] = dVar37 * dVar12 + dVar20 * dVar11;
  eerot[4] = dVar37 * dVar31 + dVar20 * dVar12;
  eerot[5] = dVar23 * dVar13 + ((dVar35 * dVar22 - dVar22 * dVar34) - dVar25 * dVar33);
  dVar1 = dVar3 * 0.175;
  dVar16 = (dVar17 - dVar29) * dVar4;
  eetrans[1] = (dVar38 * dVar4 - dVar24 * dVar2 * 5.39999999136e-06) * dVar10 +
               dVar33 * dVar28 +
               dVar6 * 1.095 * dVar3 +
               (dVar3 * 2.159999996544e-10 * dVar17 - dVar3 * 2.159999996544e-10 * dVar29) * dVar10
               + dVar1 * dVar7 +
                 dVar1 * dVar9 +
                 dVar13 * dVar32 +
                 (dVar3 * 5.39999999136e-06 * dVar29 - dVar17 * dVar3 * 5.39999999136e-06) * dVar5 +
                 dVar22 * dVar36 +
                 dVar3 * 1.271 * dVar17 +
                 (dVar26 * dVar4 - dVar2 * 2.159999996544e-10 * dVar24) * dVar5 +
                 (dVar15 * dVar22 - dVar3 * 1.271 * dVar29) + dVar1;
  eerot[6] = dVar16 * dVar11 + dVar19 * dVar12;
  eerot[7] = dVar19 * dVar31 + dVar16 * dVar12;
  eerot[8] = ((dVar35 * dVar30 - dVar25 * dVar14) - dVar23 * dVar14) - dVar34 * dVar30;
  eetrans[2] = dVar28 * dVar14 +
               (dVar7 * -2.159999996544e-10 + dVar9 * -2.159999996544e-10) * dVar10 +
               dVar30 * dVar15 +
               dVar8 * 1.095 +
               (dVar29 * 5.39999999136e-06 + dVar17 * -5.39999999136e-06) * dVar2 * dVar10 +
               (dVar17 * -2.159999996544e-10 + dVar29 * 2.159999996544e-10) * dVar2 * dVar5 +
               (dVar9 * 5.39999999136e-06 + dVar7 * 5.39999999136e-06) * dVar5 +
               dVar7 * -1.271 +
               dVar9 * -1.271 +
               ((dVar17 * 0.175 + dVar36 * dVar30 + dVar29 * -0.175 + 0.495) - dVar32 * dVar14);
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50,x51,x52,x53,x54,x55,x56,x57,x58,x59,x60,x61,x62,x63,x64;
x0=IKcos(j[0]);
x1=IKcos(j[3]);
x2=IKsin(j[0]);
x3=IKsin(j[3]);
x4=IKsin(j[4]);
x5=IKsin(j[1]);
x6=IKsin(j[2]);
x7=IKcos(j[1]);
x8=IKcos(j[2]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.134999999784)*x4);
x13=((5.39999999136e-6)*x4);
x14=((0.9999999992)*x4);
x15=((1.271)*x0);
x16=((1.271)*x2);
x17=((5.39999999136e-6)*x0);
x18=((0.175)*x0);
x19=((3.9999999968e-5)*x4);
x20=((5.39999999136e-6)*x9);
x21=((0.175)*x2);
x22=((0.134999999784)*x9);
x23=((3.9999999968e-5)*x9);
x24=((0.9999999992)*x9);
x25=((1.0)*x2);
x26=((5.39999999136e-6)*x1);
x27=((1.095)*x5);
x28=((2.159999996544e-10)*x0);
x29=((1.0)*x0);
x30=((2.159999996544e-10)*x2);
x31=((2.159999996544e-10)*x1);
x32=((5.39999999136e-6)*x2);
x33=(x5*x6);
x34=(x7*x8);
x35=(x1*x9);
x36=(x2*x3);
x37=(x6*x7);
x38=(x5*x8);
x39=((1.0)*x34);
x40=(x29*x33);
x41=(x25*x33);
x42=((((-1.0)*x39))+x33);
x43=((((-1.0)*x33))+x39);
x44=((((1.0)*x38))+(((1.0)*x37)));
x45=((-1.0)*x44);
x46=(x1*x42);
x47=(x3*x43);
x48=((((-1.0)*x40))+((x0*x34)));
x49=((((-1.0)*x41))+((x2*x34)));
x50=((((-1.0)*x29*x34))+x40);
x51=((((-1.0)*x25*x34))+x41);
x52=(x29*((x38+x37)));
x53=((-1.0)*x52);
x54=(x25*((x38+x37)));
x55=((-1.0)*x54);
x56=(x1*x55);
x57=((((-1.0)*x25*x3))+((x1*x53)));
x58=(((x3*x52))+(((-1.0)*x1*x25)));
x59=(((x0*x3))+x56);
x60=(((x0*x1))+((x3*x54)));
x61=(x4*x57);
x62=(((x19*x46))+((x23*x45))+((x14*x44))+((x24*x46)));
x63=(((x14*x50))+((x23*x48))+((x19*x57))+((x24*x57)));
x64=(((x14*x51))+((x23*x49))+((x19*x59))+((x24*x59)));
eerot[0]=(((x11*x63))+((x10*x58)));
eerot[1]=((((-1.0)*x10*x63))+((x11*x58)));
eerot[2]=(((x14*x57))+(((-1.0)*x23*x57))+(((-1.0)*x19*x50))+((x24*x48)));
IkReal x65=((1.0)*x33);
eetrans[0]=(((x12*x57))+((x0*x27))+(((-1.0)*x15*x65))+((x18*x37))+((x18*x38))+(((-1.0)*x20*x57))+((x22*x48))+((x4*(((((-2.159999996544e-10)*x36))+((x31*x53))))))+((x15*x34))+((x9*((((x28*x34))+(((-1.0)*x28*x65))))))+x18+((x9*((((x26*x53))+(((-5.39999999136e-6)*x36))))))+(((-1.0)*x13*x50))+((x4*((((x17*x33))+(((-1.0)*x17*x34)))))));
eerot[3]=(((x11*x64))+((x10*x60)));
eerot[4]=((((-1.0)*x10*x64))+((x11*x60)));
eerot[5]=(((x14*x59))+(((-1.0)*x23*x59))+(((-1.0)*x19*x51))+((x24*x49)));
IkReal x66=((1.0)*x33);
eetrans[1]=((((-1.0)*x16*x66))+((x12*x59))+((x4*((((x31*x55))+((x28*x3))))))+((x16*x34))+(((-1.0)*x20*x59))+((x4*((((x32*x33))+(((-1.0)*x32*x34))))))+((x22*x49))+((x21*x38))+((x21*x37))+((x9*(((((-1.0)*x30*x66))+((x30*x34))))))+((x2*x27))+x21+(((-1.0)*x13*x51))+((x9*((((x26*x55))+((x17*x3)))))));
eerot[6]=(((x10*x47))+((x11*x62)));
eerot[7]=((((-1.0)*x10*x62))+((x11*x47)));
eerot[8]=(((x14*x46))+(((-1.0)*x19*x44))+((x24*x45))+(((-1.0)*x23*x46)));
eetrans[2]=((0.495)+(((-0.175)*x33))+(((-1.0)*x20*x46))+(((0.175)*x34))+((x22*x45))+(((-1.271)*x38))+(((-1.271)*x37))+((x4*(((((5.39999999136e-6)*x38))+(((5.39999999136e-6)*x37))))))+((x1*x4*(((((-2.159999996544e-10)*x34))+(((2.159999996544e-10)*x33))))))+((x35*(((((5.39999999136e-6)*x33))+(((-5.39999999136e-6)*x34))))))+(((1.095)*x7))+((x12*x46))+((x9*(((((-2.159999996544e-10)*x37))+(((-2.159999996544e-10)*x38))))))+(((-1.0)*x13*x44)));
}